

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScenePrivate::addPopup(QGraphicsScenePrivate *this,QGraphicsWidget *widget)

{
  QGraphicsScenePrivate *this_00;
  qsizetype qVar1;
  QGraphicsScenePrivate *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *in_stack_00000008;
  QGraphicsItem *in_stack_00000018;
  QGraphicsWidget *focusWidget;
  QFocusEvent event;
  undefined4 in_stack_ffffffffffffff98;
  FocusReason in_stack_ffffffffffffff9c;
  QGraphicsScenePrivate *in_stack_ffffffffffffffa0;
  QGraphicsWidget *in_stack_ffffffffffffffa8;
  undefined1 implicit;
  QGraphicsScenePrivate *in_stack_ffffffffffffffb0;
  QEvent *event_00;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QGraphicsWidget_*>::operator<<
            ((QList<QGraphicsWidget_*> *)in_stack_ffffffffffffffa0,
             (parameter_type)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = (QGraphicsScenePrivate *)QGraphicsWidget::focusWidget(in_stack_ffffffffffffffa8);
  if (this_00 == (QGraphicsScenePrivate *)0x0) {
    event_00 = (QEvent *)0x0;
    if (in_RSI != (QGraphicsScenePrivate *)0x0) {
      event_00 = (QEvent *)&in_RSI->field_0x10;
    }
    in_stack_ffffffffffffffb0 = in_RSI;
    grabKeyboard(in_stack_ffffffffffffffa0,in_stack_00000008);
    if ((in_RDI[0x18].d_ptr.d != (QGraphicsItemPrivate *)0x0) &&
       (qVar1 = QList<QGraphicsWidget_*>::size((QList<QGraphicsWidget_*> *)(in_RDI + 0x1c)),
       qVar1 == 1)) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusOut,PopupFocusReason);
      sendEvent(this_00,in_RDI,event_00);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
    }
  }
  else {
    QGraphicsItem::setFocus((QGraphicsItem *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  implicit = false;
  if (in_RSI != (QGraphicsScenePrivate *)0x0) {
    implicit = (undefined1)((ulong)&in_RSI->field_0x10 >> 0x38);
  }
  grabMouse(in_stack_ffffffffffffffb0,in_stack_00000018,(bool)implicit);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::addPopup(QGraphicsWidget *widget)
{
    Q_ASSERT(widget);
    Q_ASSERT(!popupWidgets.contains(widget));
    popupWidgets << widget;
    if (QGraphicsWidget *focusWidget = widget->focusWidget()) {
        focusWidget->setFocus(Qt::PopupFocusReason);
    } else {
        grabKeyboard((QGraphicsItem *)widget);
        if (focusItem && popupWidgets.size() == 1) {
            QFocusEvent event(QEvent::FocusOut, Qt::PopupFocusReason);
            sendEvent(focusItem, &event);
        }
    }
    grabMouse((QGraphicsItem *)widget);
}